

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseExprPrimary(State *state)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined4 uVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  bool bVar11;
  char *pcVar12;
  long lVar13;
  State copy;
  
  pcVar2 = state->mangled_cur;
  pcVar3 = state->out_cur;
  pcVar4 = state->out_begin;
  pcVar5 = state->out_end;
  pcVar6 = state->prev_name;
  uVar7 = state->prev_name_length;
  uVar8 = state->nest_level;
  uVar9 = state->append;
  uVar10 = state->overflowed;
  if (*state->mangled_cur == 'L') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar11 = ParseType(state);
    if (!bVar11) goto LAB_00120343;
    bVar11 = ParseNumber(state,(int *)0x0);
    if ((!bVar11) || (pcVar12 = state->mangled_cur, *pcVar12 != 'E')) goto LAB_00120343;
LAB_00120421:
    state->mangled_cur = pcVar12 + 1;
    bVar11 = true;
  }
  else {
LAB_00120343:
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar11 = ParseType(state);
      if (bVar11) {
        lVar13 = 0;
        for (pcVar12 = state->mangled_cur;
            (cVar1 = *pcVar12, cVar1 != '\0' &&
            ((byte)(cVar1 - 0x30U) < 10 || (byte)(cVar1 + 0x9fU) < 6)); pcVar12 = pcVar12 + 1) {
          lVar13 = lVar13 + -1;
        }
        if ((lVar13 != 0) && (state->mangled_cur = pcVar12, *pcVar12 == 'E')) goto LAB_00120421;
      }
    }
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    if (*state->mangled_cur == 'L') {
      state->mangled_cur = state->mangled_cur + 1;
      bVar11 = ParseMangledName(state);
      if ((bVar11) && (pcVar12 = state->mangled_cur, *pcVar12 == 'E')) goto LAB_00120421;
    }
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    bVar11 = ParseTwoCharToken(state,"LZ");
    if (bVar11) {
      bVar11 = ParseEncoding(state);
      if ((bVar11) && (pcVar12 = state->mangled_cur, *pcVar12 == 'E')) goto LAB_00120421;
    }
    bVar11 = false;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
    state->prev_name = pcVar6;
    state->prev_name_length = uVar7;
    state->nest_level = uVar8;
    state->append = (bool)uVar9;
    state->overflowed = (bool)uVar10;
    state->mangled_cur = pcVar2;
    state->out_cur = pcVar3;
    state->out_begin = pcVar4;
    state->out_end = pcVar5;
  }
  return bVar11;
}

Assistant:

static bool ParseExprPrimary(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseNumber(state, NULL) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseType(state) &&
      ParseFloatNumber(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseOneCharToken(state, 'L') && ParseMangledName(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  if (ParseTwoCharToken(state, "LZ") && ParseEncoding(state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;

  return false;
}